

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Func::SetDoFastPaths(Func *this)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  uint uVar5;
  
  if ((this->field_0x242 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x374,"(!this->hasCalledSetDoFastPaths)","!this->hasCalledSetDoFastPaths");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,FastPathPhase,sourceContextId,functionId);
  uVar5 = 0x100000;
  if (!bVar2) {
    EVar3 = JITTimeWorkItem::GetJitMode(this->m_workItem);
    if ((EVar3 != SimpleJit) || (DAT_015bbe4c == '\x01')) {
      uVar5 = 0x100008;
    }
  }
  *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xffeffff7 | uVar5;
  return;
}

Assistant:

void
Func::SetDoFastPaths()
{
    // Make sure we only call this once!
    Assert(!this->hasCalledSetDoFastPaths);

    bool doFastPaths = false;

    if(!PHASE_OFF(Js::FastPathPhase, this) && (!IsSimpleJit() || CONFIG_FLAG(NewSimpleJit)))
    {
        doFastPaths = true;
    }

    this->m_doFastPaths = doFastPaths;
#ifdef DBG
    this->hasCalledSetDoFastPaths = true;
#endif
}